

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_3f792fb::MemPoolAccept::ConsensusScriptChecks
          (MemPoolAccept *this,ATMPArgs *args,Workspace *ws)

{
  void *this_00;
  CTransaction *this_01;
  CTxMemPool *hash;
  ChainstateManager *pCVar1;
  pointer pCVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  uint flags;
  CCoinsViewCache *this_02;
  Coin *pCVar6;
  ulong uVar7;
  Coin *pCVar8;
  ulong uVar9;
  pointer outpoint;
  CCoinsViewCache *this_03;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  string_view source_file;
  string_view logging_function;
  string local_78;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (void *)args[3].m_accept_time;
  this_01 = *(CTransaction **)
             ((args[3].m_chainparams)->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems;
  flags = GetBlockScriptFlags((this->m_active_chainstate->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-1],
                              this->m_active_chainstate->m_chainman);
  hash = this->m_pool;
  this_02 = Chainstate::CoinsTip(this->m_active_chainstate);
  pCVar1 = this->m_active_chainstate->m_chainman;
  bVar4 = CTransaction::IsCoinBase(this_01);
  if (bVar4) {
    __assert_fail("!tx.IsCoinBase()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x192,
                  "bool CheckInputsFromMempoolAndCache(const CTransaction &, TxValidationState &, const CCoinsViewCache &, const CTxMemPool &, unsigned int, PrecomputedTransactionData &, CCoinsViewCache &, ValidationCache &)"
                 );
  }
  this_03 = &this->m_view;
  outpoint = (this_01->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
  pCVar2 = (this_01->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (outpoint == pCVar2) {
LAB_00b0ac47:
    bVar4 = CheckInputScripts(this_01,(TxValidationState *)&args[3].m_bypass_limits,this_03,flags,
                              true,true,(PrecomputedTransactionData *)&args[4].m_coins_to_uncache,
                              &pCVar1->m_validation_cache,
                              (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0);
    bVar5 = true;
    if (bVar4) goto LAB_00b0ad23;
  }
  else {
    pCVar6 = CCoinsViewCache::AccessCoin(this_03,&outpoint->prevout);
    if ((pCVar6->out).nValue != -1) {
      do {
        CTxMemPool::get((CTxMemPool *)local_58,(uint256 *)hash);
        if ((pointer)local_58._0_8_ == (pointer)0x0) {
          pCVar8 = CCoinsViewCache::AccessCoin(this_02,&outpoint->prevout);
          lVar3 = (pCVar8->out).nValue;
          if (lVar3 == -1) {
            __assert_fail("!coinFromUTXOSet.IsSpent()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x1a6,
                          "bool CheckInputsFromMempoolAndCache(const CTransaction &, TxValidationState &, const CCoinsViewCache &, const CTxMemPool &, unsigned int, PrecomputedTransactionData &, CCoinsViewCache &, ValidationCache &)"
                         );
          }
          if ((lVar3 != (pCVar6->out).nValue) ||
             (bVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                                (&(pCVar8->out).scriptPubKey.super_CScriptBase,
                                 &(pCVar6->out).scriptPubKey.super_CScriptBase), !bVar4)) {
            __assert_fail("coinFromUTXOSet.out == coin.out",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x1a7,
                          "bool CheckInputsFromMempoolAndCache(const CTransaction &, TxValidationState &, const CCoinsViewCache &, const CTxMemPool &, unsigned int, PrecomputedTransactionData &, CCoinsViewCache &, ValidationCache &)"
                         );
          }
        }
        else {
          auVar11[0] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0]
                        == *(uchar *)(local_58._0_8_ + 0x39));
          auVar11[1] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1]
                        == *(uchar *)(local_58._0_8_ + 0x3a));
          auVar11[2] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2]
                        == *(uchar *)(local_58._0_8_ + 0x3b));
          auVar11[3] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3]
                        == *(uchar *)(local_58._0_8_ + 0x3c));
          auVar11[4] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4]
                        == *(uchar *)(local_58._0_8_ + 0x3d));
          auVar11[5] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5]
                        == *(uchar *)(local_58._0_8_ + 0x3e));
          auVar11[6] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6]
                        == *(uchar *)(local_58._0_8_ + 0x3f));
          auVar11[7] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7]
                        == *(uchar *)(local_58._0_8_ + 0x40));
          auVar11[8] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8]
                        == *(uchar *)(local_58._0_8_ + 0x41));
          auVar11[9] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9]
                        == *(uchar *)(local_58._0_8_ + 0x42));
          auVar11[10] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                          [10] == *(uchar *)(local_58._0_8_ + 0x43));
          auVar11[0xb] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0xb] == *(uchar *)(local_58._0_8_ + 0x44));
          auVar11[0xc] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0xc] == *(uchar *)(local_58._0_8_ + 0x45));
          auVar11[0xd] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0xd] == *(uchar *)(local_58._0_8_ + 0x46));
          auVar11[0xe] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0xe] == *(uchar *)(local_58._0_8_ + 0x47));
          auVar11[0xf] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0xf] == *(uchar *)(local_58._0_8_ + 0x48));
          auVar10[0] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0x10] == *(uchar *)(local_58._0_8_ + 0x49));
          auVar10[1] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0x11] == *(uchar *)(local_58._0_8_ + 0x4a));
          auVar10[2] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0x12] == *(uchar *)(local_58._0_8_ + 0x4b));
          auVar10[3] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0x13] == *(uchar *)(local_58._0_8_ + 0x4c));
          auVar10[4] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0x14] == *(uchar *)(local_58._0_8_ + 0x4d));
          auVar10[5] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0x15] == *(uchar *)(local_58._0_8_ + 0x4e));
          auVar10[6] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0x16] == *(uchar *)(local_58._0_8_ + 0x4f));
          auVar10[7] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0x17] == *(uchar *)(local_58._0_8_ + 0x50));
          auVar10[8] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0x18] == *(uchar *)(local_58._0_8_ + 0x51));
          auVar10[9] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0x19] == *(uchar *)(local_58._0_8_ + 0x52));
          auVar10[10] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                          [0x1a] == *(uchar *)(local_58._0_8_ + 0x53));
          auVar10[0xb] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0x1b] == *(uchar *)(local_58._0_8_ + 0x54));
          auVar10[0xc] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0x1c] == *(uchar *)(local_58._0_8_ + 0x55));
          auVar10[0xd] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0x1d] == *(uchar *)(local_58._0_8_ + 0x56));
          auVar10[0xe] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0x1e] == *(uchar *)(local_58._0_8_ + 0x57));
          auVar10[0xf] = -((outpoint->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                           [0x1f] == *(uchar *)(local_58._0_8_ + 0x58));
          auVar10 = auVar10 & auVar11;
          if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) != 0xffff) {
            __assert_fail("txFrom->GetHash() == txin.prevout.hash",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x1a1,
                          "bool CheckInputsFromMempoolAndCache(const CTransaction &, TxValidationState &, const CCoinsViewCache &, const CTxMemPool &, unsigned int, PrecomputedTransactionData &, CCoinsViewCache &, ValidationCache &)"
                         );
          }
          lVar3 = *(long *)(local_58._0_8_ + 0x18);
          uVar9 = (*(long *)(local_58._0_8_ + 0x20) - lVar3 >> 3) * -0x3333333333333333;
          uVar7 = (ulong)(outpoint->prevout).n;
          if (uVar9 < uVar7 || uVar9 - uVar7 == 0) {
            __assert_fail("txFrom->vout.size() > txin.prevout.n",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x1a2,
                          "bool CheckInputsFromMempoolAndCache(const CTransaction &, TxValidationState &, const CCoinsViewCache &, const CTxMemPool &, unsigned int, PrecomputedTransactionData &, CCoinsViewCache &, ValidationCache &)"
                         );
          }
          if ((*(long *)(lVar3 + uVar7 * 0x28) != (pCVar6->out).nValue) ||
             (bVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                 (lVar3 + uVar7 * 0x28 + 8),
                                 &(pCVar6->out).scriptPubKey.super_CScriptBase), !bVar4)) {
            __assert_fail("txFrom->vout[txin.prevout.n] == coin.out",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x1a3,
                          "bool CheckInputsFromMempoolAndCache(const CTransaction &, TxValidationState &, const CCoinsViewCache &, const CTxMemPool &, unsigned int, PrecomputedTransactionData &, CCoinsViewCache &, ValidationCache &)"
                         );
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
        }
        outpoint = outpoint + 1;
        if (outpoint == pCVar2) goto LAB_00b0ac47;
        pCVar6 = CCoinsViewCache::AccessCoin(this_03,&outpoint->prevout);
      } while ((pCVar6->out).nValue != -1);
      if (outpoint == pCVar2) goto LAB_00b0ac47;
    }
  }
  base_blob<256u>::ToString_abi_cxx11_((string *)local_58,this_00);
  ValidationState<TxValidationResult>::ToString_abi_cxx11_
            (&local_78,(ValidationState<TxValidationResult> *)&args[3].m_bypass_limits);
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
  ;
  source_file._M_len = 0x5e;
  logging_function._M_str = "ConsensusScriptChecks";
  logging_function._M_len = 0x15;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function,source_file,0x501,ALL,Info,(ConstevalFormatString<2U>)0xfd71ae,
             (string *)local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  bVar5 = false;
LAB_00b0ad23:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool MemPoolAccept::ConsensusScriptChecks(const ATMPArgs& args, Workspace& ws)
{
    AssertLockHeld(cs_main);
    AssertLockHeld(m_pool.cs);
    const CTransaction& tx = *ws.m_ptx;
    const uint256& hash = ws.m_hash;
    TxValidationState& state = ws.m_state;

    // Check again against the current block tip's script verification
    // flags to cache our script execution flags. This is, of course,
    // useless if the next block has different script flags from the
    // previous one, but because the cache tracks script flags for us it
    // will auto-invalidate and we'll just have a few blocks of extra
    // misses on soft-fork activation.
    //
    // This is also useful in case of bugs in the standard flags that cause
    // transactions to pass as valid when they're actually invalid. For
    // instance the STRICTENC flag was incorrectly allowing certain
    // CHECKSIG NOT scripts to pass, even though they were invalid.
    //
    // There is a similar check in CreateNewBlock() to prevent creating
    // invalid blocks (using TestBlockValidity), however allowing such
    // transactions into the mempool can be exploited as a DoS attack.
    unsigned int currentBlockScriptVerifyFlags{GetBlockScriptFlags(*m_active_chainstate.m_chain.Tip(), m_active_chainstate.m_chainman)};
    if (!CheckInputsFromMempoolAndCache(tx, state, m_view, m_pool, currentBlockScriptVerifyFlags,
                                        ws.m_precomputed_txdata, m_active_chainstate.CoinsTip(), GetValidationCache())) {
        LogPrintf("BUG! PLEASE REPORT THIS! CheckInputScripts failed against latest-block but not STANDARD flags %s, %s\n", hash.ToString(), state.ToString());
        return Assume(false);
    }

    return true;
}